

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O3

int32_t CVmObjBigNum::ext_to_int(char *ext,int *ov)

{
  uint32_t uVar1;
  
  *ov = 0;
  uVar1 = convert_to_int_base(ext,ov);
  if ((ext[4] & 1U) == 0) {
    if ((int)uVar1 < 0) {
      *ov = 1;
    }
  }
  else {
    if (0x80000000 < uVar1) {
      *ov = 1;
    }
    uVar1 = -uVar1;
  }
  return uVar1;
}

Assistant:

int32_t CVmObjBigNum::ext_to_int(const char *ext, int &ov)
{        
    /* get the magnitude */
    ov = FALSE;
    uint32_t m = convert_to_int_base(ext, ov);

    /* apply the sign and check limits */
    if (get_neg(ext))
    {
        /* 
         *   a T3 VM int is a 32-bit signed value (irrespective of the local
         *   platform int size), so the magnitude of a negative value can't
         *   exceed 2147483648
         */
        if (m > 2147483648U)
            ov = TRUE;

        /* negate the number and return it */
        return -(long)m;
    }
    else
    {
        /* 
         *   a T3 VM positive int value can't exceed 2147483647L (regardless
         *   of the local platform int size) 
         */
        if (m > 2147483647U)
            ov = TRUE;

        /* return the value */
        return (long)m;
    }
}